

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderLocals.cpp
# Opt level: O1

void __thiscall wasm::ReorderLocals::~ReorderLocals(ReorderLocals *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pTVar3;
  pointer pcVar4;
  
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__ReorderLocals_00d8ab58;
  puVar2 = (this->firstUses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->firstUses).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->counts).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pTVar3 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
           ).super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.
           super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>
                                          .
                                          super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar3);
  }
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d87048;
  pcVar4 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
           ).super_Pass.name._M_dataplus._M_p;
  paVar1 = &(this->
            super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
            ).super_Pass.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }